

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O2

CURLcode Curl_cwriter_add(Curl_easy *data,Curl_cwriter *writer)

{
  Curl_cwriter *pCVar1;
  CURLcode CVar2;
  Curl_cwriter **ppCVar3;
  
  if (((data->req).writer_stack == (Curl_cwriter *)0x0) &&
     (CVar2 = do_init_writer_stack(data), CVar2 != CURLE_OK)) {
    return CVar2;
  }
  ppCVar3 = &(data->req).writer_stack;
  while ((pCVar1 = *ppCVar3, pCVar1 != (Curl_cwriter *)0x0 && (pCVar1->phase < writer->phase))) {
    ppCVar3 = &pCVar1->next;
  }
  writer->next = pCVar1;
  *ppCVar3 = writer;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_cwriter_add(struct Curl_easy *data,
                          struct Curl_cwriter *writer)
{
  CURLcode result;
  struct Curl_cwriter **anchor = &data->req.writer_stack;

  if(!*anchor) {
    result = do_init_writer_stack(data);
    if(result)
      return result;
  }

  /* Insert the writer as first in its phase.
   * Skip existing writers of lower phases. */
  while(*anchor && (*anchor)->phase < writer->phase)
    anchor = &((*anchor)->next);
  writer->next = *anchor;
  *anchor = writer;
  return CURLE_OK;
}